

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O1

self_type * __thiscall
boost::function<void_(const_boost::debug::dbg_startup_info_&)>::operator=
          (function<void_(const_boost::debug::dbg_startup_info_&)> *this,self_type *f)

{
  vtable_base *pvVar1;
  function1<void,_const_boost::debug::dbg_startup_info_&> local_28;
  
  local_28.super_function_base.vtable = (vtable_base *)0x0;
  pvVar1 = (f->super_function1<void,_const_boost::debug::dbg_startup_info_&>).super_function_base.
           vtable;
  if (pvVar1 != (vtable_base *)0x0) {
    local_28.super_function_base.vtable = pvVar1;
    if (((ulong)pvVar1 & 1) == 0) {
      (*pvVar1->manager)(&(f->super_function1<void,_const_boost::debug::dbg_startup_info_&>).
                          super_function_base.functor,&local_28.super_function_base.functor,
                         clone_functor_tag);
    }
    else {
      local_28.super_function_base.functor._16_8_ =
           *(undefined8 *)
            ((long)&(f->super_function1<void,_const_boost::debug::dbg_startup_info_&>).
                    super_function_base.functor + 0x10);
      local_28.super_function_base.functor.members._0_8_ =
           (undefined8)
           *(undefined8 *)
            &(f->super_function1<void,_const_boost::debug::dbg_startup_info_&>).super_function_base.
             functor;
      local_28.super_function_base.functor._8_8_ =
           *(undefined8 *)
            ((long)&(f->super_function1<void,_const_boost::debug::dbg_startup_info_&>).
                    super_function_base.functor + 8);
    }
  }
  function1<void,_const_boost::debug::dbg_startup_info_&>::swap
            (&local_28,&this->super_function1<void,_const_boost::debug::dbg_startup_info_&>);
  function1<void,_const_boost::debug::dbg_startup_info_&>::~function1(&local_28);
  return this;
}

Assistant:

self_type& operator=(const self_type& f)
  {
    self_type(f).swap(*this);
    return *this;
  }